

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network4.c
# Opt level: O2

int net_udp4_recv_socket(char *hostname,unsigned_short port)

{
  int iVar1;
  int iVar2;
  char *__s;
  sockaddr_in addr;
  ip_mreq mreq;
  
  iVar1 = net_ip4_resolve_hostname(hostname,port,(uchar *)0x0,&addr);
  if (iVar1 == 0) {
    addr.sin_addr.s_addr = 0;
  }
  iVar1 = net_udp4_socket(&addr,port,'\x01');
  if (-1 < iVar1) {
    iVar2 = bind(iVar1,(sockaddr *)&addr,0x10);
    if (iVar2 < 0) {
      __s = "bind";
    }
    else {
      if ((addr.sin_addr.s_addr & 0xf0) != 0xe0) {
        return iVar1;
      }
      mreq.imr_multiaddr = addr.sin_addr;
      mreq.imr_interface.s_addr = 0;
      iVar2 = setsockopt(iVar1,0,0x23,&mreq,8);
      if (-1 < iVar2) {
        return iVar1;
      }
      __s = "setsockopt";
    }
    perror(__s);
    iVar1 = close(iVar1);
    if (iVar1 < 0) {
      perror("close");
    }
  }
  return -1;
}

Assistant:

int net_udp4_recv_socket(char *hostname,
                         unsigned short port) {
  struct sockaddr_in addr;
  if (!net_ip4_resolve_hostname(hostname, port, NULL, &addr))
    memset(&addr.sin_addr, 0, sizeof(addr.sin_addr));

  /*M
    Create udp socket.
  **/
  int fd;
  if ((fd = net_udp4_socket(&addr, port, 1)) < 0)
    return -1;

  /*M
    Bind to hostname.
  **/
  if (bind(fd, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
    perror("bind");
    goto error;
  }

  /*M
    Add multicast membership if address is a multicast address.
  **/
  if (IN_MULTICAST(htonl(addr.sin_addr.s_addr))) {
    struct ip_mreq mreq;
    mreq.imr_multiaddr.s_addr = addr.sin_addr.s_addr;
    mreq.imr_interface.s_addr = htonl(INADDR_ANY);

    if (setsockopt(fd,
                   IPPROTO_IP,
                   IP_ADD_MEMBERSHIP,
                   &mreq, sizeof(mreq)) < 0) {
      perror("setsockopt");
      goto error;
    }
  }

  return fd;

 error:
  if (close(fd) < 0)
    perror("close");
  return -1;
}